

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassBase.hpp
# Opt level: O0

void __thiscall
Diligent::RenderPassBase<Diligent::EngineGLImplTraits>::RenderPassBase
          (RenderPassBase<Diligent::EngineGLImplTraits> *this,IReferenceCounters *pRefCounters,
          RenderDeviceImplType *pDevice,RenderPassDesc *Desc,bool bIsDeviceInternal)

{
  RenderDeviceInfo *DeviceInfo;
  GraphicsAdapterInfo *AdapterInfo;
  void *__p;
  STDDeleter<void,_Diligent::IMemoryAllocator> local_b0;
  unique_ptr<void,Diligent::STDDeleter<void,Diligent::IMemoryAllocator>> local_a8 [16];
  undefined1 local_98 [8];
  FixedLinearAllocator MemPool;
  IMemoryAllocator *RawAllocator;
  bool bIsDeviceInternal_local;
  RenderPassDesc *Desc_local;
  RenderDeviceImplType *pDevice_local;
  IReferenceCounters *pRefCounters_local;
  RenderPassBase<Diligent::EngineGLImplTraits> *this_local;
  
  DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>::
  DeviceObjectBase(&this->
                    super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
                   ,pRefCounters,pDevice,Desc,bIsDeviceInternal);
  (this->
  super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
  ).super_ObjectBase<Diligent::IRenderPass>.super_RefCountedObject<Diligent::IRenderPass>.
  super_IRenderPass.super_IDeviceObject.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_013a4ac0;
  std::unique_ptr<void,Diligent::STDDeleter<void,Diligent::IMemoryAllocator>>::
  unique_ptr<Diligent::STDDeleter<void,Diligent::IMemoryAllocator>,void>
            ((unique_ptr<void,Diligent::STDDeleter<void,Diligent::IMemoryAllocator>> *)
             &this->m_pRawMemory);
  this->m_AttachmentStates = (RESOURCE_STATE *)0x0;
  this->m_AttachmentFirstLastUse = (pair<unsigned_int,_unsigned_int> *)0x0;
  this->m_IsDestructed = false;
  if (pDevice != (RenderDeviceImplType *)0x0) {
    DeviceInfo = RenderDeviceBase<Diligent::EngineGLImplTraits>::GetDeviceInfo
                           (&pDevice->super_RenderDeviceBase<Diligent::EngineGLImplTraits>);
    AdapterInfo = RenderDeviceBase<Diligent::EngineGLImplTraits>::GetAdapterInfo
                            (&pDevice->super_RenderDeviceBase<Diligent::EngineGLImplTraits>);
    ValidateRenderPassDesc
              (&(this->
                super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
                ).m_Desc,DeviceInfo,AdapterInfo);
  }
  MemPool._72_8_ = GetRawAllocator();
  FixedLinearAllocator::FixedLinearAllocator
            ((FixedLinearAllocator *)local_98,(IMemoryAllocator *)MemPool._72_8_);
  ReserveSpace(this,&(this->
                     super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
                     ).m_Desc,(FixedLinearAllocator *)local_98);
  FixedLinearAllocator::Reserve((FixedLinearAllocator *)local_98);
  __p = FixedLinearAllocator::ReleaseOwnership((FixedLinearAllocator *)local_98);
  STDDeleter<void,_Diligent::IMemoryAllocator>::STDDeleter
            (&local_b0,(IMemoryAllocator *)MemPool._72_8_);
  std::unique_ptr<void,Diligent::STDDeleter<void,Diligent::IMemoryAllocator>>::
  unique_ptr<Diligent::STDDeleter<void,Diligent::IMemoryAllocator>,void>(local_a8,__p,&local_b0);
  std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::operator=
            (&this->m_pRawMemory,
             (unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)local_a8);
  std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::~unique_ptr
            ((unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)local_a8);
  CopyDesc(this,&(this->
                 super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
                 ).m_Desc,&this->m_AttachmentStates,&this->m_AttachmentFirstLastUse,
           (FixedLinearAllocator *)local_98);
  FixedLinearAllocator::~FixedLinearAllocator((FixedLinearAllocator *)local_98);
  return;
}

Assistant:

RenderPassBase(IReferenceCounters*   pRefCounters,
                   RenderDeviceImplType* pDevice,
                   const RenderPassDesc& Desc,
                   bool                  bIsDeviceInternal = false) :
        TDeviceObjectBase{pRefCounters, pDevice, Desc, bIsDeviceInternal}
    {
        try
        {
            if (pDevice != nullptr)
            {
                ValidateRenderPassDesc(this->m_Desc, pDevice->GetDeviceInfo(), pDevice->GetAdapterInfo());
            }

            IMemoryAllocator&    RawAllocator = GetRawAllocator();
            FixedLinearAllocator MemPool{RawAllocator};
            ReserveSpace(this->m_Desc, MemPool);

            MemPool.Reserve();
            // The memory is now owned by RenderPassBase and will be freed by Destruct().
            m_pRawMemory = decltype(m_pRawMemory){MemPool.ReleaseOwnership(), STDDeleterRawMem<void>{RawAllocator}};

            CopyDesc(this->m_Desc, m_AttachmentStates, m_AttachmentFirstLastUse, MemPool);
        }
        catch (...)
        {
            Destruct();
            throw;
        }
    }